

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

Vector2f __thiscall
sf::RenderTarget::mapPixelToCoords(RenderTarget *this,Vector2i *point,View *view)

{
  Transform *this_00;
  Vector2f VVar1;
  float fVar2;
  float fVar5;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  IntRect IVar6;
  Vector2f local_20;
  
  local_20.x = 0.0;
  local_20.y = 0.0;
  IVar6 = getViewport(this,view);
  auVar4._0_4_ = (float)IVar6.width;
  auVar4._4_4_ = (float)IVar6.height;
  auVar4._8_8_ = 0;
  fVar2 = (float)(*point).x - (float)IVar6.left;
  fVar5 = (float)(*point).y - (float)IVar6.top;
  auVar3._0_4_ = fVar2 + fVar2;
  auVar3._4_4_ = fVar5 + fVar5;
  auVar3._8_8_ = 0;
  auVar4 = divps(auVar3,auVar4);
  local_20.y = 1.0 - auVar4._4_4_;
  local_20.x = auVar4._0_4_ + -1.0;
  this_00 = View::getInverseTransform(view);
  VVar1 = Transform::transformPoint(this_00,&local_20);
  return VVar1;
}

Assistant:

Vector2f RenderTarget::mapPixelToCoords(const Vector2i& point, const View& view) const
{
    // First, convert from viewport coordinates to homogeneous coordinates
    Vector2f normalized;
    FloatRect viewport = FloatRect(getViewport(view));
    normalized.x = -1.f + 2.f * (static_cast<float>(point.x) - viewport.left) / viewport.width;
    normalized.y =  1.f - 2.f * (static_cast<float>(point.y) - viewport.top)  / viewport.height;

    // Then transform by the inverse of the view matrix
    return view.getInverseTransform().transformPoint(normalized);
}